

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameDatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::NameDatatypeValidator::checkValueSpace
          (NameDatatypeValidator *this,XMLCh *content,MemoryManager *manager)

{
  bool bVar1;
  InvalidDatatypeValueException *this_00;
  
  bVar1 = XMLChar1_0::isValidName(content);
  if (bVar1) {
    return;
  }
  this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
  InvalidDatatypeValueException::InvalidDatatypeValueException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/NameDatatypeValidator.cpp"
             ,0x6c,VALUE_Invalid_Name,content,(XMLCh *)SchemaSymbols::fgDT_NAME,(XMLCh *)0x0,
             (XMLCh *)0x0,manager);
  __cxa_throw(this_00,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
}

Assistant:

void NameDatatypeValidator::checkValueSpace(const XMLCh* const content
                                            , MemoryManager* const manager)
{
    //
    // 3.3.6 check must: "Name"
    //
    if ( !XMLChar1_0::isValidName(content))
    {
        ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                , XMLExcepts::VALUE_Invalid_Name
                , content
                , SchemaSymbols::fgDT_NAME
                , manager);
    }

}